

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O1

void amrex::VisMF::Initialize(void)

{
  int headerVersion;
  ParmParse pp;
  string local_88;
  ParmParse local_68;
  
  if ((anonymous_namespace)::initialized == '\0') {
    nOutFiles = 1;
    nMFFileInStreams = 1;
    ExecOnFinalize((PTR_TO_VOID_FUNC)0x54d189);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"vismf","");
    ParmParse::ParmParse(&local_68,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    ParmParse::queryAdd<int,_0>(&local_68,"v",&verbose);
    local_88._M_dataplus._M_p._0_4_ = currentVersion;
    ParmParse::queryAdd<int,_0>(&local_68,"headerversion",(int *)&local_88);
    if ((int)local_88._M_dataplus._M_p != currentVersion) {
      currentVersion = (int)local_88._M_dataplus._M_p;
    }
    ParmParse::queryAdd<bool,_0>(&local_68,"groupsets",(bool *)&groupSets);
    ParmParse::queryAdd<bool,_0>(&local_68,"setbuf",(bool *)&setBuf);
    ParmParse::queryAdd<bool,_0>(&local_68,"usesingleread",(bool *)&useSingleRead);
    ParmParse::queryAdd<bool,_0>(&local_68,"usesinglewrite",(bool *)&useSingleWrite);
    ParmParse::queryAdd<bool,_0>(&local_68,"checkfilepositions",(bool *)&checkFilePositions);
    ParmParse::queryAdd<bool,_0>(&local_68,"usepersistentifstreams",(bool *)&usePersistentIFStreams)
    ;
    ParmParse::queryAdd<bool,_0>(&local_68,"usesynchronousreads",(bool *)&useSynchronousReads);
    ParmParse::queryAdd<bool,_0>(&local_68,"usedynamicsetselection",(bool *)&useDynamicSetSelection)
    ;
    ParmParse::queryAdd<long,_0>(&local_68,"iobuffersize",&VisMFBuffer::ioBufferSize);
    ParmParse::queryAdd<bool,_0>(&local_68,"allowsparsewrites",(bool *)&allowSparseWrites);
    (anonymous_namespace)::initialized = '\x01';
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68);
  }
  return;
}

Assistant:

void
VisMF::Initialize ()
{
    if(initialized) {
      return;
    }
    //
    // Use the same defaults as in Amr.cpp.
    //
    VisMF::SetNOutFiles(nOutFiles);

    VisMF::SetMFFileInStreams(nMFFileInStreams);

    amrex::ExecOnFinalize(VisMF::Finalize);

    ParmParse pp("vismf");
    pp.queryAdd("v",verbose);

    int headerVersion(currentVersion);
    pp.queryAdd("headerversion", headerVersion);
    if(headerVersion != currentVersion) {
      currentVersion = static_cast<VisMF::Header::Version> (headerVersion);
    }

    pp.queryAdd("groupsets", groupSets);
    pp.queryAdd("setbuf", setBuf);
    pp.queryAdd("usesingleread", useSingleRead);
    pp.queryAdd("usesinglewrite", useSingleWrite);
    pp.queryAdd("checkfilepositions", checkFilePositions);
    pp.queryAdd("usepersistentifstreams", usePersistentIFStreams);
    pp.queryAdd("usesynchronousreads", useSynchronousReads);
    pp.queryAdd("usedynamicsetselection", useDynamicSetSelection);
    pp.queryAdd("iobuffersize", ioBufferSize);
    pp.queryAdd("allowsparsewrites", allowSparseWrites);

    initialized = true;
}